

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProfiler.cpp
# Opt level: O3

ChProfileNode * __thiscall
chrono::utils::ChProfileNode::Get_Sub_Node(ChProfileNode *this,char *name)

{
  ChProfileNode *pCVar1;
  
  pCVar1 = this->Child;
  while( true ) {
    if (pCVar1 == (ChProfileNode *)0x0) {
      pCVar1 = (ChProfileNode *)::operator_new(0x38);
      ChProfileNode(pCVar1,name,this);
      pCVar1->Sibling = this->Child;
      this->Child = pCVar1;
      return pCVar1;
    }
    if (pCVar1->Name == name) break;
    pCVar1 = pCVar1->Sibling;
  }
  return pCVar1;
}

Assistant:

ChProfileNode * ChProfileNode::Get_Sub_Node( const char * name )
{
	// Try to find this sub node
	ChProfileNode * child = Child;
	while ( child ) {
		if ( child->Name == name ) {
			return child;
		}
		child = child->Sibling;
	}

	// We didn't find it, so add it
	
	ChProfileNode * node = new ChProfileNode( name, this );
	node->Sibling = Child;
	Child = node;
	return node;
}